

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_ALG_ASYM_Unmarshal(TPMI_ALG_ASYM *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_ALG_ASYM TVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT16_Unmarshal(target,buffer,size);
  if (TVar2 == 0) {
    TVar1 = *target;
    if (((TVar1 == 1) || (TVar1 == 0x23)) || ((TVar2 = 0x81, TVar1 == 0x10 && (flag != 0)))) {
      TVar2 = 0;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_ALG_ASYM_Unmarshal(TPMI_ALG_ASYM *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_RSA
        case TPM_ALG_RSA:
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
#endif // ALG_ECC
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_ASYMMETRIC;
        default:
            return TPM_RC_ASYMMETRIC;
    }
    return TPM_RC_SUCCESS;
}